

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1121::run(TestCase1121 *this)

{
  TestNetwork *this_00;
  Reader vatId;
  TestNetworkAdapter *pTVar1;
  bool bVar2;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  Reader value;
  StringPtr name;
  StringPtr name_00;
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  local_3d8;
  Own<capnp::ClientHook> local_398;
  Client bootstrap;
  Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  response;
  ArrayPtr<const_char> local_330;
  Client client;
  undefined1 local_308 [24];
  Client gateway;
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  local_2d8;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  TestContext context;
  Builder hostId;
  Maybe<capnp::MessageSize> local_128;
  MallocMessageBuilder hostIdBuilder;
  
  kj::heap<capnp::_::(anonymous_namespace)::TestGateway>();
  RealmGateway<capnproto_test::capnp::test::TestSturdyRef,capnp::Text,capnp::AnyPointer,capnp::AnyPointer>
  ::Client::Client<capnp::_::(anonymous_namespace)::TestGateway,void>
            ((Client *)&gateway,(Own<capnp::_::(anonymous_namespace)::TestGateway> *)&context);
  kj::Own<capnp::_::(anonymous_namespace)::TestGateway>::~Own
            ((Own<capnp::_::(anonymous_namespace)::TestGateway> *)&context);
  kj::heap<capnp::_::(anonymous_namespace)::TestPersistentText,char_const(&)[4]>
            ((char (*) [4])&context);
  Persistent<capnp::Text,capnp::AnyPointer>::Client::
  Client<capnp::_::(anonymous_namespace)::TestPersistentText,void>
            ((Client *)&bootstrap,
             (Own<capnp::_::(anonymous_namespace)::TestPersistentText> *)&context);
  kj::Own<capnp::_::(anonymous_namespace)::TestPersistentText>::~Own
            ((Own<capnp::_::(anonymous_namespace)::TestPersistentText> *)&context);
  MallocMessageBuilder::MallocMessageBuilder(&hostIdBuilder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestSturdyRefHostId>
            (&hostId,&hostIdBuilder.super_MessageBuilder);
  value.super_StringPtr.content.size_ = 7;
  value.super_StringPtr.content.ptr = "server";
  capnproto_test::capnp::test::TestSturdyRefHostId::Builder::setHost(&hostId,value);
  (**(code **)(**(long **)(&bootstrap.field_0x8 + (long)bootstrap._vptr_Client[-3]) + 0x20))
            (&local_398);
  RealmGateway<capnproto_test::capnp::test::TestSturdyRef,_capnp::Text,_capnp::AnyPointer,_capnp::AnyPointer>
  ::Client::Client((Client *)local_308,&gateway);
  kj::EventLoop::EventLoop(&context.loop);
  kj::WaitScope::WaitScope(&context.waitScope,&context.loop);
  this_00 = &context.network;
  TestNetwork::TestNetwork(this_00);
  context.restorer.super_SturdyRefRestorer<capnproto_test::capnp::test::TestSturdyRefObjectId>.
  super_SturdyRefRestorerBase._vptr_SturdyRefRestorerBase =
       (SturdyRefRestorerBase)&PTR_baseRestore_0065c4e0;
  context.restorer.callCount = 0;
  context.restorer.handleCount = 0;
  name.content.size_ = 7;
  name.content.ptr = "client";
  context.clientNetwork = TestNetwork::add(this_00,name);
  name_00.content.size_ = 7;
  name_00.content.ptr = "server";
  context.serverNetwork = TestNetwork::add(this_00,name_00);
  pTVar1 = context.clientNetwork;
  RealmGateway<capnproto_test::capnp::test::TestSturdyRef,_capnp::Text,_capnp::AnyPointer,_capnp::AnyPointer>
  ::Client::Client((Client *)&response,(Client *)local_308);
  makeRpcClient<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestProvisionId,capnproto_test::capnp::test::TestRecipientId,capnproto_test::capnp::test::TestThirdPartyCapId,capnproto_test::capnp::test::TestJoinResult,capnp::RealmGateway<capnproto_test::capnp::test::TestSturdyRef,capnp::Text,capnp::AnyPointer,capnp::AnyPointer>::Client,capnproto_test::capnp::test::TestSturdyRef,capnp::Text>
            ((capnp *)&context.rpcClient,&pTVar1->super_TestNetworkAdapterBase,(Client *)&response);
  kj::Own<capnp::ClientHook>::dispose
            ((Own<capnp::ClientHook> *)&response.super_Reader._reader.capTable);
  pTVar1 = context.serverNetwork;
  (*(local_398.ptr)->_vptr_ClientHook[4])(&local_3d8);
  makeRpcServer<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestProvisionId,capnproto_test::capnp::test::TestRecipientId,capnproto_test::capnp::test::TestThirdPartyCapId,capnproto_test::capnp::test::TestJoinResult>
            ((capnp *)&context.rpcServer,&pTVar1->super_TestNetworkAdapterBase,(Client *)&local_3d8)
  ;
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&local_3d8);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_308 + 8));
  kj::Own<capnp::ClientHook>::dispose(&local_398);
  StructBuilder::asReader(&hostId._builder);
  vatId._reader.capTable = (CapTableReader *)uStack_290;
  vatId._reader.segment = (SegmentReader *)local_298;
  vatId._reader.data = (void *)local_288;
  vatId._reader.pointers = (WirePointer *)uStack_280;
  vatId._reader.dataSize = (undefined4)local_278;
  vatId._reader.pointerCount = local_278._4_2_;
  vatId._reader._38_2_ = local_278._6_2_;
  vatId._reader._40_8_ = uStack_270;
  RpcSystemBase::baseBootstrap((RpcSystemBase *)&response,vatId);
  Capability::Client::
  castAs<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,capnp::AnyPointer>>
            (&client,(Client *)&response);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&response);
  local_128.ptr.isSet = false;
  Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::Client::saveRequest
            (&local_2d8,&client,&local_128);
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  ::send(&local_3d8,(int)&local_2d8,__buf,in_RCX,in_R8D);
  kj::
  Promise<capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>_>
  ::wait((Promise<capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>_>
          *)&response,&local_3d8);
  RemotePromise<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  ::~RemotePromise((RemotePromise<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
                    *)&local_3d8);
  kj::Own<capnp::RequestHook>::dispose(&local_2d8.hook);
  Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults::Reader::
  getSturdyRef((ReaderFor<capnproto_test::capnp::test::TestSturdyRef> *)&local_3d8,
               &response.super_Reader);
  local_2d8.super_Builder._builder.data = (WirePointer *)0x0;
  if (1 < local_3d8.super_Builder._builder.pointerCount) {
    local_2d8.super_Builder._builder.data = local_3d8.super_Builder._builder.pointers + 1;
  }
  local_2d8.super_Builder._builder.segment._0_4_ = local_3d8.super_Builder._builder.segment._0_4_;
  local_2d8.super_Builder._builder.segment._4_4_ = local_3d8.super_Builder._builder.segment._4_4_;
  local_2d8.super_Builder._builder.capTable._0_4_ = local_3d8.super_Builder._builder.capTable._0_4_;
  local_2d8.super_Builder._builder.capTable._4_4_ = local_3d8.super_Builder._builder.capTable._4_4_;
  local_2d8.super_Builder._builder.pointers._0_4_ = local_3d8.hook.disposer._0_4_;
  if (1 >= local_3d8.super_Builder._builder.pointerCount) {
    local_2d8.super_Builder._builder.segment._0_4_ = 0;
    local_2d8.super_Builder._builder.segment._4_4_ = 0;
    local_2d8.super_Builder._builder.capTable._0_4_ = 0;
    local_2d8.super_Builder._builder.capTable._4_4_ = 0;
    local_2d8.super_Builder._builder.pointers._0_4_ = 0x7fffffff;
  }
  local_330 = (ArrayPtr<const_char>)AnyPointer::Reader::getAs<capnp::Text>((Reader *)&local_2d8);
  bVar2 = kj::operator==("imported-foo",(StringPtr *)&local_330);
  if (!bVar2 && kj::_::Debug::minSeverity < 3) {
    Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults::Reader::
    getSturdyRef((ReaderFor<capnproto_test::capnp::test::TestSturdyRef> *)&local_3d8,
                 &response.super_Reader);
    local_2d8.super_Builder._builder.data = (WirePointer *)0x0;
    if (1 < local_3d8.super_Builder._builder.pointerCount) {
      local_2d8.super_Builder._builder.data = local_3d8.super_Builder._builder.pointers + 1;
    }
    if (1 >= local_3d8.super_Builder._builder.pointerCount) {
      local_3d8.super_Builder._builder.segment._0_4_ = 0;
      local_3d8.super_Builder._builder.segment._4_4_ = 0;
      local_3d8.super_Builder._builder.capTable._0_4_ = 0;
      local_3d8.super_Builder._builder.capTable._4_4_ = 0;
      local_3d8.hook.disposer._0_4_ = 0x7fffffff;
    }
    local_2d8.super_Builder._builder.segment._0_4_ = local_3d8.super_Builder._builder.segment._0_4_;
    local_2d8.super_Builder._builder.segment._4_4_ = local_3d8.super_Builder._builder.segment._4_4_;
    local_2d8.super_Builder._builder.capTable._0_4_ =
         local_3d8.super_Builder._builder.capTable._0_4_;
    local_2d8.super_Builder._builder.capTable._4_4_ =
         local_3d8.super_Builder._builder.capTable._4_4_;
    local_2d8.super_Builder._builder.pointers._0_4_ = local_3d8.hook.disposer._0_4_;
    local_330 = (ArrayPtr<const_char>)AnyPointer::Reader::getAs<capnp::Text>((Reader *)&local_2d8);
    kj::_::Debug::log<char_const(&)[91],char_const(&)[13],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x46e,ERROR,
               "\"failed: expected \" \"(\\\"imported-foo\\\") == (response.getSturdyRef().getObjectId().getAs<Text>())\", \"imported-foo\", response.getSturdyRef().getObjectId().getAs<Text>()"
               ,(char (*) [91])
                "failed: expected (\"imported-foo\") == (response.getSturdyRef().getObjectId().getAs<Text>())"
               ,(char (*) [13])"imported-foo",(Reader *)&local_330);
  }
  kj::Own<capnp::ResponseHook>::dispose(&response.hook);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&client.field_0x8);
  TestContext::~TestContext(&context);
  MallocMessageBuilder::~MallocMessageBuilder(&hostIdBuilder);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&bootstrap.field_0x8);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&gateway.field_0x8);
  return;
}

Assistant:

TEST(Rpc, RealmGatewayImport) {
  TestRealmGateway::Client gateway = kj::heap<TestGateway>();
  Persistent<Text>::Client bootstrap = kj::heap<TestPersistentText>("foo");

  MallocMessageBuilder hostIdBuilder;
  auto hostId = hostIdBuilder.getRoot<test::TestSturdyRefHostId>();
  hostId.setHost("server");

  TestContext context(bootstrap, gateway);
  auto client = context.rpcClient.bootstrap(hostId).castAs<Persistent<test::TestSturdyRef>>();

  auto response = client.saveRequest().send().wait(context.waitScope);

  EXPECT_EQ("imported-foo", response.getSturdyRef().getObjectId().getAs<Text>());
}